

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::JavascriptGeneratorFunction::GetSetter
          (JavascriptGeneratorFunction *this,JavascriptString *propertyNameString,Var *setterValue,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  PropertyId PVar1;
  ScriptContext *this_00;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  JavascriptString *propertyNameString_local;
  JavascriptGeneratorFunction *this_local;
  
  propertyRecord = (PropertyRecord *)requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)setterValue;
  setterValue_local = (Var *)propertyNameString;
  propertyNameString_local = (JavascriptString *)this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ScriptContext::FindPropertyRecord(this_00,(JavascriptString *)setterValue_local,&local_40);
  if ((local_40 == (PropertyRecord *)0x0) ||
     ((PVar1 = PropertyRecord::GetPropertyId(local_40), PVar1 != 0x1cd &&
      (PVar1 = PropertyRecord::GetPropertyId(local_40), PVar1 != 0x1cf)))) {
    this_local._4_4_ =
         JavascriptFunction::GetSetter
                   ((JavascriptFunction *)this,(JavascriptString *)setterValue_local,
                    &info_local->m_instance,(PropertyValueInfo *)requestContext_local,
                    (ScriptContext *)propertyRecord);
  }
  else {
    this_local._4_4_ =
         DynamicObject::GetSetter
                   ((DynamicObject *)this,(JavascriptString *)setterValue_local,
                    &info_local->m_instance,(PropertyValueInfo *)requestContext_local,
                    (ScriptContext *)propertyRecord);
  }
  return this_local._4_4_;
}

Assistant:

DescriptorFlags JavascriptGeneratorFunction::GetSetter(JavascriptString* propertyNameString, Var *setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr)
        {
            if ((propertyRecord->GetPropertyId() == PropertyIds::caller || propertyRecord->GetPropertyId() == PropertyIds::arguments))
            {
                // JavascriptFunction has special case for caller and arguments; call DynamicObject:: virtual directly to skip that.
                return DynamicObject::GetSetter(propertyNameString, setterValue, info, requestContext);
            }
        }

        return JavascriptFunction::GetSetter(propertyNameString, setterValue, info, requestContext);
    }